

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NoncentralRelativeAdapter.cpp
# Opt level: O1

void __thiscall
opengv::relative_pose::NoncentralRelativeAdapter::NoncentralRelativeAdapter
          (NoncentralRelativeAdapter *this,bearingVectors_t *bearingVectors1,
          bearingVectors_t *bearingVectors2,camCorrespondences_t *camCorrespondences1,
          camCorrespondences_t *camCorrespondences2,translations_t *camOffsets,
          rotations_t *camRotations,rotation_t *R12)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  (this->super_RelativeAdapterBase)._vptr_RelativeAdapterBase =
       (_func_int **)&PTR__RelativeAdapterBase_0026bb90;
  (this->super_RelativeAdapterBase)._t12.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] = 0.0;
  (this->super_RelativeAdapterBase)._t12.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] = 0.0;
  (this->super_RelativeAdapterBase)._t12.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] = 0.0;
  dVar1 = (R12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [1];
  dVar2 = (R12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [2];
  dVar3 = (R12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [3];
  dVar4 = (R12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [4];
  dVar5 = (R12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [5];
  dVar6 = (R12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [6];
  dVar7 = (R12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [7];
  (this->super_RelativeAdapterBase)._R12.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       (R12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0]
  ;
  (this->super_RelativeAdapterBase)._R12.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] = dVar1;
  (this->super_RelativeAdapterBase)._R12.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] = dVar2;
  (this->super_RelativeAdapterBase)._R12.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] = dVar3;
  (this->super_RelativeAdapterBase)._R12.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] = dVar4;
  (this->super_RelativeAdapterBase)._R12.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] = dVar5;
  (this->super_RelativeAdapterBase)._R12.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] = dVar6;
  (this->super_RelativeAdapterBase)._R12.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] = dVar7;
  (this->super_RelativeAdapterBase)._R12.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] =
       (R12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8]
  ;
  (this->super_RelativeAdapterBase)._vptr_RelativeAdapterBase =
       (_func_int **)&PTR__NoncentralRelativeAdapter_0026bb08;
  this->_bearingVectors1 = bearingVectors1;
  this->_bearingVectors2 = bearingVectors2;
  this->_camCorrespondences1 = camCorrespondences1;
  this->_camCorrespondences2 = camCorrespondences2;
  this->_camOffsets = camOffsets;
  this->_camRotations = camRotations;
  return;
}

Assistant:

opengv::relative_pose::NoncentralRelativeAdapter::NoncentralRelativeAdapter(
    const bearingVectors_t & bearingVectors1,
    const bearingVectors_t & bearingVectors2,
    const camCorrespondences_t & camCorrespondences1,
    const camCorrespondences_t & camCorrespondences2,
    const translations_t & camOffsets,
    const rotations_t & camRotations,
    const rotation_t & R12 ) :
    RelativeAdapterBase(R12),
    _bearingVectors1(bearingVectors1),
    _bearingVectors2(bearingVectors2),
    _camCorrespondences1(camCorrespondences1),
    _camCorrespondences2(camCorrespondences2),
    _camOffsets(camOffsets),
    _camRotations(camRotations)
{}